

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseExpression(Parser *this,Precedence prec)

{
  bool bVar1;
  undefined7 in_register_00000031;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_40;
  undefined4 local_34;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> local_30;
  undefined1 local_28 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> primary;
  Precedence prec_local;
  Parser *this_local;
  
  caps = (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
         CONCAT71(in_register_00000031,prec);
  std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>::
  unique_ptr<std::default_delete<pfederc::Capabilities>,void>
            ((unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>> *)
             &local_30,(nullptr_t)0x0);
  parsePrimary((Parser *)local_28,caps);
  std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::~unique_ptr
            (&local_30);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_28);
  if (bVar1) {
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
              (&local_40,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_28)
    ;
    parseBinary(this,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)caps,
                (Precedence)&local_40);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_40);
  }
  else {
    Lexer::next((Lexer *)(caps->_M_t).
                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
  }
  local_34 = 1;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_28);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseExpression(Precedence prec) noexcept {
  auto primary = parsePrimary();
  if (!primary) {
    lexer.next();
    /*generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EXPR, lexer.getCurrentToken()->getPosition()));*/
    return nullptr; // error forwarding
  }
  
  return parseBinary(std::move(primary), prec);
}